

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

bool cfd::core::ScriptOperator::IsOpSuccess(ScriptType op_code,bool is_elements)

{
  byte bVar1;
  bool bVar2;
  
  bVar1 = 1;
  if ((((0x3e < op_code - kOpReserved) ||
       ((0x667bc00000040001U >> ((ulong)(op_code - kOpReserved) & 0x3f) & 1) == 0)) &&
      ((0x2a < op_code - kOpMul || ((0x7c00000001fU >> ((ulong)(op_code - kOpMul) & 0x3f) & 1) == 0)
       ))) && (bVar2 = op_code - kOpSuccess195 < 0x37, bVar1 = op_code == kOpSuccess252 || bVar2,
              !is_elements && (op_code != kOpSuccess252 && !bVar2))) {
    if (op_code - kOpDeterministricRandom < 0x3f) {
      bVar1 = (byte)(0x6c00000000000007 >> ((byte)(op_code - kOpDeterministricRandom) & 0x3f));
    }
    else {
      bVar1 = 0;
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool ScriptOperator::IsOpSuccess(ScriptType op_code, bool is_elements) {
  if ((op_code == kOpSuccess80) || (op_code == kOpSuccess98) ||
      ((op_code >= kOpSuccess126) && (op_code <= kOpSuccess129)) ||
      ((op_code >= kOpSuccess131) && (op_code <= kOpSuccess134)) ||
      ((op_code >= kOpSuccess137) && (op_code <= kOpSuccess138)) ||
      ((op_code >= kOpSuccess141) && (op_code <= kOpSuccess142)) ||
      ((op_code >= kOpSuccess149) && (op_code <= kOpSuccess153)) ||
      ((op_code >= kOpSuccess187) && (op_code <= kOpSuccess191)) ||
      ((op_code >= kOpSuccess195) && (op_code <= kOpSuccess249)) ||
      (op_code == kOpSuccess252)) {
    return true;
  } else if (!is_elements) {
    if (((op_code >= kOpSuccess192) && (op_code <= kOpSuccess194)) ||
        ((op_code >= kOpSuccess250) && (op_code <= kOpSuccess251)) ||
        ((op_code >= kOpSuccess253) && (op_code <= kOpSuccess254))) {
      return true;
    }
  }
  return false;
}